

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

uint * fetchRGBToRGB32<(QImage::Format)29>
                 (uint *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
                 QDitherInfo *param_6)

{
  uint uVar1;
  uint64_t uVar2;
  int in_ECX;
  undefined4 in_EDX;
  uint *in_RDI;
  uchar *in_R8;
  QList<unsigned_int> *in_R9;
  int i;
  BPP BPP;
  int local_38;
  int index_00;
  uint *local_8;
  
  index_00 = 5;
  uVar2 = qCpuFeatures();
  if ((uVar2 & 4) == 4) {
    fetchPixelsBPP24_ssse3
              ((uint *)CONCAT44(in_EDX,in_ECX),in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9);
    convertToRGB32<(QImage::Format)29>
              ((uint *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),in_R9);
    local_8 = in_RDI;
  }
  else {
    for (local_38 = 0; local_8 = in_RDI, local_38 < in_ECX; local_38 = local_38 + 1) {
      fetchPixel<(QPixelLayout::BPP)5>((uchar *)in_R9,index_00);
      uVar1 = convertPixelToRGB32<(QImage::Format)29>((uint)((ulong)in_RDI >> 0x20));
      in_RDI[local_38] = uVar1;
    }
  }
  return local_8;
}

Assistant:

static const uint *QT_FASTCALL fetchRGBToRGB32(uint *buffer, const uchar *src, int index, int count,
                                               const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP BPP = bitsPerPixel<Format>();
#if defined(__SSE2__) && !defined(__SSSE3__) && QT_COMPILER_SUPPORTS_SSSE3
    if (BPP == QPixelLayout::BPP24 && qCpuHasFeature(SSSE3)) {
        // With SSE2 can convertToRGB32 be vectorized, but it takes SSSE3
        // to vectorize the deforested version below.
        fetchPixelsBPP24_ssse3(buffer, src, index, count);
        convertToRGB32<Format>(buffer, count, nullptr);
        return buffer;
    }
#elif defined QT_COMPILER_SUPPORTS_LSX
    if (BPP == QPixelLayout::BPP24 && qCpuHasFeature(LSX)) {
        fetchPixelsBPP24_lsx(buffer, src, index, count);
        convertToRGB32<Format>(buffer, count, nullptr);
        return buffer;
    }
#endif
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32<Format>(fetchPixel<BPP>(src, index + i));
    return buffer;
}